

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  parasail_result_t *ppVar4;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar28;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  int iVar36;
  undefined1 auVar35 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar37 [16];
  int iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  int iVar48;
  int iVar49;
  int iVar50;
  undefined1 auVar47 [16];
  uint uVar51;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  __m128i vMaxH;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  undefined1 local_108 [16];
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  undefined1 local_88 [16];
  long local_70;
  int *local_68;
  ulong local_60;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [16];
  
  if (_s2 == (char *)0x0) {
    parasail_sw_table_diag_sse41_128_32_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_table_diag_sse41_128_32_cold_6();
  }
  else if (open < 0) {
    parasail_sw_table_diag_sse41_128_32_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_table_diag_sse41_128_32_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_table_diag_sse41_128_32_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_table_diag_sse41_128_32_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sw_table_diag_sse41_128_32_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      _s1Len = matrix->length;
    }
    iVar3 = matrix->min;
    uVar13 = 0x80000000 - iVar3;
    if (iVar3 != -open && SBORROW4(iVar3,-open) == iVar3 + open < 0) {
      uVar13 = open | 0x80000000;
    }
    uVar13 = uVar13 + 1;
    uVar12 = 0x7ffffffe - matrix->max;
    local_88._4_4_ = uVar13;
    local_88._0_4_ = uVar13;
    local_88._8_4_ = uVar13;
    local_88._12_4_ = uVar13;
    local_108._4_4_ = uVar13;
    local_108._0_4_ = uVar13;
    local_108._8_4_ = uVar13;
    local_108._12_4_ = uVar13;
    local_d8._4_4_ = uVar13;
    local_d8._0_4_ = uVar13;
    local_d8._8_4_ = uVar13;
    local_d8._12_4_ = uVar13;
    ppVar4 = parasail_result_new_table1(_s1Len,s2Len);
    if (ppVar4 != (parasail_result_t *)0x0) {
      ppVar4->flag = ppVar4->flag | 0x4421004;
      uVar11 = (ulong)(s2Len + 6);
      local_a8 = gap;
      local_98 = open;
      ptr = parasail_memalign_int32_t(0x10,uVar11);
      ptr_00 = parasail_memalign_int32_t(0x10,uVar11);
      ptr_01 = parasail_memalign_int32_t(0x10,uVar11);
      if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
        if (matrix->type == 0) {
          local_b8 = _s1Len + 3;
          ptr_02 = parasail_memalign_int32_t(0x10,(long)local_b8);
          if (ptr_02 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < _s1Len) {
            piVar1 = matrix->mapper;
            uVar11 = 0;
            do {
              ptr_02[uVar11] = piVar1[(byte)_s1[uVar11]];
              uVar11 = uVar11 + 1;
            } while ((uint)_s1Len != uVar11);
          }
          iVar3 = _s1Len + 1U;
          if ((int)(_s1Len + 1U) < local_b8) {
            iVar3 = local_b8;
          }
          memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar3) * 4 + 4);
        }
        else {
          ptr_02 = (int32_t *)0x0;
        }
        uVar14 = s2Len + 3;
        local_48._4_4_ = uVar13;
        local_48._0_4_ = uVar13;
        local_48._8_4_ = uVar13;
        local_48._12_4_ = uVar13;
        local_48 = local_48 >> 0x20;
        iStack_94 = local_98;
        iStack_90 = local_98;
        iStack_8c = local_98;
        iStack_a4 = local_a8;
        iStack_a0 = local_a8;
        iStack_9c = local_a8;
        piVar1 = matrix->mapper;
        uVar11 = 1;
        if (1 < s2Len) {
          uVar11 = (ulong)(uint)s2Len;
        }
        uVar8 = 0;
        do {
          ptr[uVar8 + 3] = piVar1[(byte)_s2[uVar8]];
          uVar8 = uVar8 + 1;
        } while (uVar11 != uVar8);
        ptr[2] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        uVar8 = (ulong)(uint)s2Len;
        uVar51 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar14) {
          uVar51 = uVar14;
        }
        uVar20 = 0;
        local_c8 = uVar12;
        uStack_c4 = uVar12;
        uStack_c0 = uVar12;
        uStack_bc = uVar12;
        local_b8 = s2Len;
        iStack_b4 = s2Len;
        iStack_b0 = s2Len;
        iStack_ac = s2Len;
        local_58 = _s1Len;
        uStack_54 = _s1Len;
        uStack_50 = _s1Len;
        uStack_4c = _s1Len;
        memset(ptr + uVar8 + 3,0,(ulong)(~s2Len + uVar51) * 4 + 4);
        do {
          ptr_00[uVar20 + 3] = 0;
          ptr_01[uVar20 + 3] = uVar13;
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
        lVar5 = 0;
        do {
          ptr_00[lVar5] = uVar13;
          ptr_01[lVar5] = uVar13;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        lVar5 = uVar8 + 3;
        do {
          ptr_00[lVar5] = uVar13;
          ptr_01[lVar5] = uVar13;
          lVar5 = lVar5 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar14);
        local_148 = uVar13;
        uStack_144 = uVar13;
        uStack_140 = uVar13;
        uStack_13c = uVar13;
        local_138 = local_c8;
        uStack_134 = uStack_c4;
        uStack_130 = uStack_c0;
        uStack_12c = uStack_bc;
        if (0 < _s1Len) {
          local_68 = matrix->matrix;
          uVar12 = _s1Len - 1;
          uVar11 = 1;
          if (1 < (int)uVar14) {
            uVar11 = (ulong)uVar14;
          }
          uVar20 = (ulong)(uint)_s1Len;
          local_70 = uVar8 * 0x10;
          local_e0 = uVar8 * 4 + -4;
          local_f0 = uVar8 * 0xc + -0xc;
          local_f8 = uVar8 * 8 + -8;
          auVar37 = pmovsxbd(in_XMM6,0x10203);
          local_e8 = 0;
          uVar19 = 0;
          do {
            iVar3 = matrix->type;
            uVar51 = (uint)uVar19;
            uVar14 = uVar51;
            if (iVar3 == 0) {
              uVar14 = ptr_02[uVar19];
            }
            uVar21 = uVar19 | 1;
            if (iVar3 == 0) {
              uVar15 = ptr_02[uVar21];
            }
            else {
              uVar15 = uVar12;
              if (uVar21 < uVar20) {
                uVar15 = uVar51 | 1;
              }
            }
            uVar9 = uVar19 | 2;
            if (iVar3 == 0) {
              uVar17 = ptr_02[uVar9];
            }
            else {
              uVar17 = uVar12;
              if (uVar9 < uVar20) {
                uVar17 = uVar51 | 2;
              }
            }
            local_60 = uVar19;
            uVar6 = uVar19 | 3;
            if (iVar3 == 0) {
              uVar18 = ptr_02[uVar6];
            }
            else {
              uVar18 = uVar12;
              if (uVar6 < uVar20) {
                uVar18 = uVar51 | 3;
              }
            }
            iVar3 = matrix->size;
            auVar43._0_4_ = -(uint)(auVar37._0_4_ < (int)local_58);
            iVar7 = auVar37._4_4_;
            auVar43._4_4_ = -(uint)(iVar7 < (int)uStack_54);
            iVar10 = auVar37._8_4_;
            auVar43._8_4_ = -(uint)(iVar10 < (int)uStack_50);
            iVar38 = auVar37._12_4_;
            auVar43._12_4_ = -(uint)(iVar38 < (int)uStack_4c);
            uVar16 = 0;
            in_XMM8 = pmovsxbd(in_XMM8,0xfffefd);
            auVar40._4_4_ = uVar13;
            auVar40._0_4_ = uVar13;
            auVar40._8_4_ = uVar13;
            auVar40._12_4_ = uVar13;
            auVar35 = local_48;
            auVar42 = local_48;
            auVar47 = auVar40;
            do {
              iVar22 = local_68[(long)(int)(uVar18 * iVar3) + (long)ptr[uVar16]] + auVar42._0_4_;
              iVar25 = local_68[(long)(int)(uVar17 * iVar3) + (long)ptr[uVar16 + 1]] + auVar42._4_4_
              ;
              iVar26 = local_68[(long)(int)(uVar15 * iVar3) + (long)ptr[uVar16 + 2]] + auVar42._8_4_
              ;
              iVar27 = local_68[(long)(int)(uVar14 * iVar3) + (long)ptr[uVar16 + 3]] +
                       auVar42._12_4_;
              iVar36 = auVar35._12_4_;
              auVar42._0_8_ = auVar35._4_8_;
              auVar41._0_12_ = auVar35._4_12_;
              auVar41._12_4_ = iVar36;
              auVar42._8_8_ = auVar41._8_8_ & 0xffffffff | (ulong)(uint)ptr_00[uVar16 + 3] << 0x20;
              iVar28 = auVar35._4_4_ - local_98;
              iVar31 = auVar35._8_4_ - iStack_94;
              iVar32 = iVar36 - iStack_90;
              iVar33 = ptr_00[uVar16 + 3] - iStack_8c;
              iVar46 = auVar47._4_4_ - local_a8;
              iVar48 = auVar47._8_4_ - iStack_a4;
              iVar49 = auVar47._12_4_ - iStack_a0;
              iVar50 = ptr_01[uVar16 + 3] - iStack_9c;
              auVar47._0_4_ = (uint)(iVar46 < iVar28) * iVar28 | (uint)(iVar46 >= iVar28) * iVar46;
              auVar47._4_4_ = (uint)(iVar48 < iVar31) * iVar31 | (uint)(iVar48 >= iVar31) * iVar48;
              auVar47._8_4_ = (uint)(iVar49 < iVar32) * iVar32 | (uint)(iVar49 >= iVar32) * iVar49;
              auVar47._12_4_ = (uint)(iVar50 < iVar33) * iVar33 | (uint)(iVar50 >= iVar33) * iVar50;
              iVar28 = auVar35._0_4_ - local_98;
              iVar31 = auVar35._4_4_ - iStack_94;
              iVar32 = auVar35._8_4_ - iStack_90;
              iVar36 = iVar36 - iStack_8c;
              iVar33 = auVar40._0_4_ - local_a8;
              iVar46 = auVar40._4_4_ - iStack_a4;
              iVar48 = auVar40._8_4_ - iStack_a0;
              iVar49 = auVar40._12_4_ - iStack_9c;
              auVar39._0_4_ = (uint)(iVar33 < iVar28) * iVar28 | (uint)(iVar33 >= iVar28) * iVar33;
              auVar39._4_4_ = (uint)(iVar46 < iVar31) * iVar31 | (uint)(iVar46 >= iVar31) * iVar46;
              auVar39._8_4_ = (uint)(iVar48 < iVar32) * iVar32 | (uint)(iVar48 >= iVar32) * iVar48;
              auVar39._12_4_ = (uint)(iVar49 < iVar36) * iVar36 | (uint)(iVar49 >= iVar36) * iVar49;
              uVar51 = ((int)auVar39._0_4_ < (int)auVar47._0_4_) * auVar47._0_4_ |
                       ((int)auVar39._0_4_ >= (int)auVar47._0_4_) * auVar39._0_4_;
              uVar53 = ((int)auVar39._4_4_ < (int)auVar47._4_4_) * auVar47._4_4_ |
                       ((int)auVar39._4_4_ >= (int)auVar47._4_4_) * auVar39._4_4_;
              uVar54 = ((int)auVar39._8_4_ < (int)auVar47._8_4_) * auVar47._8_4_ |
                       ((int)auVar39._8_4_ >= (int)auVar47._8_4_) * auVar39._8_4_;
              uVar55 = ((int)auVar39._12_4_ < (int)auVar47._12_4_) * auVar47._12_4_ |
                       ((int)auVar39._12_4_ >= (int)auVar47._12_4_) * auVar39._12_4_;
              iVar31 = (-1 < (int)uVar51) * uVar51;
              iVar28 = (-1 < (int)uVar53) * uVar53;
              iVar32 = (-1 < (int)uVar54) * uVar54;
              iVar33 = (-1 < (int)uVar55) * uVar55;
              auVar52._0_4_ = (uint)(iVar31 < iVar22) * iVar22 | (uint)(iVar31 >= iVar22) * iVar31;
              auVar52._4_4_ = (uint)(iVar28 < iVar25) * iVar25 | (uint)(iVar28 >= iVar25) * iVar28;
              auVar52._8_4_ = (uint)(iVar32 < iVar26) * iVar26 | (uint)(iVar32 >= iVar26) * iVar32;
              auVar52._12_4_ = (uint)(iVar33 < iVar27) * iVar27 | (uint)(iVar33 >= iVar27) * iVar33;
              iVar22 = in_XMM8._0_4_;
              auVar45._0_4_ = -(uint)(iVar22 == -1);
              iVar25 = in_XMM8._4_4_;
              auVar45._4_4_ = -(uint)(iVar25 == -1);
              iVar26 = in_XMM8._8_4_;
              iVar27 = in_XMM8._12_4_;
              auVar45._8_4_ = -(uint)(iVar26 == -1);
              auVar45._12_4_ = -(uint)(iVar27 == -1);
              auVar35 = ~auVar45 & auVar52;
              auVar29._4_4_ = uVar13;
              auVar29._0_4_ = uVar13;
              auVar29._8_4_ = uVar13;
              auVar29._12_4_ = uVar13;
              auVar47 = blendvps(auVar47,auVar29,auVar45);
              auVar40 = blendvps(auVar39,auVar29,auVar45);
              iVar28 = auVar35._0_4_;
              iVar31 = auVar35._4_4_;
              iVar33 = auVar35._12_4_;
              iVar32 = auVar35._8_4_;
              if (3 < uVar16) {
                local_138 = (uint)(iVar28 < (int)local_138) * iVar28 |
                            (iVar28 >= (int)local_138) * local_138;
                uStack_134 = (uint)(iVar31 < (int)uStack_134) * iVar31 |
                             (iVar31 >= (int)uStack_134) * uStack_134;
                uStack_130 = (uint)(iVar32 < (int)uStack_130) * iVar32 |
                             (iVar32 >= (int)uStack_130) * uStack_130;
                uStack_12c = (uint)(iVar33 < (int)uStack_12c) * iVar33 |
                             (iVar33 >= (int)uStack_12c) * uStack_12c;
                local_148 = (uint)((int)local_148 < iVar28) * iVar28 |
                            ((int)local_148 >= iVar28) * local_148;
                uStack_144 = (uint)((int)uStack_144 < iVar31) * iVar31 |
                             ((int)uStack_144 >= iVar31) * uStack_144;
                uStack_140 = (uint)((int)uStack_140 < iVar32) * iVar32 |
                             ((int)uStack_140 >= iVar32) * uStack_140;
                uStack_13c = (uint)((int)uStack_13c < iVar33) * iVar33 |
                             ((int)uStack_13c >= iVar33) * uStack_13c;
              }
              piVar1 = ((ppVar4->field_4).rowcols)->score_row;
              if (uVar16 < uVar8) {
                *(int *)((long)piVar1 + uVar16 * 4 + local_e8) = iVar33;
              }
              if (uVar16 - 1 < uVar8 && uVar21 < uVar20) {
                *(int *)((long)piVar1 + uVar16 * 4 + local_e0) = iVar32;
              }
              if ((uVar9 < uVar20) && ((long)(uVar16 - 2) < (long)uVar8 && 1 < uVar16)) {
                *(int *)((long)piVar1 + uVar16 * 4 + local_f8) = iVar31;
              }
              if ((uVar6 < uVar20) && ((long)(uVar16 - 3) < (long)uVar8 && 2 < uVar16)) {
                *(int *)((long)piVar1 + uVar16 * 4 + local_f0) = iVar28;
              }
              ptr_00[uVar16] = iVar28;
              ptr_01[uVar16] = auVar47._0_4_;
              auVar23._0_4_ = -(uint)(iVar22 < local_b8);
              auVar23._4_4_ = -(uint)(iVar25 < iStack_b4);
              auVar23._8_4_ = -(uint)(iVar26 < iStack_b0);
              auVar23._12_4_ = -(uint)(iVar27 < iStack_ac);
              auVar44._0_4_ = iVar22 >> 0x1f;
              auVar44._4_4_ = iVar25 >> 0x1f;
              auVar44._8_4_ = iVar26 >> 0x1f;
              auVar44._12_4_ = iVar27 >> 0x1f;
              auVar45 = ~auVar44 & auVar23 & auVar43;
              auVar24._0_4_ = -(uint)(iVar28 == local_88._0_4_);
              auVar24._4_4_ = -(uint)(iVar31 == local_88._4_4_);
              auVar24._8_4_ = -(uint)(iVar32 == local_88._8_4_);
              auVar24._12_4_ = -(uint)(iVar33 == local_88._12_4_);
              auVar56._0_4_ = -(uint)(local_88._0_4_ < iVar28);
              auVar56._4_4_ = -(uint)(local_88._4_4_ < iVar31);
              auVar56._8_4_ = -(uint)(local_88._8_4_ < iVar32);
              auVar56._12_4_ = -(uint)(local_88._12_4_ < iVar33);
              auVar34._0_4_ = -(uint)(iVar22 < local_d8._0_4_);
              auVar34._4_4_ = -(uint)(iVar25 < local_d8._4_4_);
              auVar34._8_4_ = -(uint)(iVar26 < local_d8._8_4_);
              auVar34._12_4_ = -(uint)(iVar27 < local_d8._12_4_);
              local_88 = blendvps(local_88,auVar52,auVar56 & auVar45);
              auVar29 = blendvps(auVar56 & auVar45,auVar45,auVar34 & auVar24);
              local_108 = blendvps(local_108,auVar37,auVar29);
              local_d8 = blendvps(local_d8,in_XMM8,(auVar34 & auVar24 | auVar56) & auVar45);
              in_XMM8._0_4_ = iVar22 + 1;
              in_XMM8._4_4_ = iVar25 + 1;
              in_XMM8._8_4_ = iVar26 + 1;
              in_XMM8._12_4_ = iVar27 + 1;
              uVar16 = uVar16 + 1;
            } while (uVar11 != uVar16);
            auVar37._0_4_ = auVar37._0_4_ + 4;
            auVar37._4_4_ = iVar7 + 4;
            auVar37._8_4_ = iVar10 + 4;
            auVar37._12_4_ = iVar38 + 4;
            uVar19 = uVar19 + 4;
            local_e8 = local_e8 + local_70;
            local_e0 = local_e0 + local_70;
            local_f0 = local_f0 + local_70;
            local_f8 = local_f8 + local_70;
          } while (uVar19 < uVar20);
        }
        lVar5 = 0;
        iVar38 = 0;
        iVar3 = 0;
        iVar10 = 0;
        iVar7 = 0;
        uVar12 = uVar13;
        do {
          uVar14 = *(uint *)(local_88 + lVar5 * 4);
          if ((int)uVar12 < (int)uVar14) {
            uVar12 = uVar14;
            iVar3 = *(int *)(local_108 + lVar5 * 4);
            iVar7 = *(int *)(local_d8 + lVar5 * 4);
            iVar10 = *(int *)(local_d8 + lVar5 * 4);
            iVar38 = *(int *)(local_108 + lVar5 * 4);
          }
          else if (uVar14 == uVar12) {
            iVar28 = *(int *)(local_d8 + lVar5 * 4);
            if (iVar28 < iVar7) {
              iVar3 = *(int *)(local_108 + lVar5 * 4);
              iVar7 = iVar28;
              iVar10 = iVar28;
              iVar38 = *(int *)(local_108 + lVar5 * 4);
            }
            else if ((iVar28 == iVar7) &&
                    (iVar31 = *(int *)(local_108 + lVar5 * 4), bVar2 = iVar31 < iVar3,
                    iVar3 = iVar38, iVar7 = iVar10, bVar2)) {
              iVar3 = iVar31;
              iVar7 = iVar28;
              iVar10 = iVar28;
              iVar38 = iVar31;
            }
          }
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 != 4);
        auVar35._0_4_ = -(uint)((int)local_138 < (int)uVar13);
        auVar35._4_4_ = -(uint)((int)uStack_134 < (int)uVar13);
        auVar35._8_4_ = -(uint)((int)uStack_130 < (int)uVar13);
        auVar35._12_4_ = -(uint)((int)uStack_12c < (int)uVar13);
        auVar30._0_4_ = -(uint)((int)local_c8 < (int)local_148);
        auVar30._4_4_ = -(uint)((int)uStack_c4 < (int)uStack_144);
        auVar30._8_4_ = -(uint)((int)uStack_c0 < (int)uStack_140);
        auVar30._12_4_ = -(uint)((int)uStack_bc < (int)uStack_13c);
        iVar10 = movmskps(4,auVar30 | auVar35);
        if (iVar10 != 0) {
          *(byte *)&ppVar4->flag = (byte)ppVar4->flag | 0x40;
          uVar12 = 0;
          iVar7 = 0;
          iVar3 = 0;
        }
        ppVar4->score = uVar12;
        ppVar4->end_query = iVar3;
        ppVar4->end_ref = iVar7;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar4;
        }
        return ppVar4;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 4); /* shift in a 0 */
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vZero = _mm_set1_epi32(0);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vJLimit = _mm_set1_epi32(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            vWH = _mm_max_epi32(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi32(vJ, vNegOne),
                        _mm_cmplt_epi32(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi32(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi32(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi32(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
    }

    /* alignment ending position */
    {
        int32_t *t = (int32_t*)&vMaxH;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}